

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VDotProd(N_Vector X,N_Vector Y,sunindextype local_length,int myid)

{
  int iVar1;
  long lVar2;
  uint in_ECX;
  undefined8 in_RSI;
  N_Vector in_RDI;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  sunrealtype ans;
  sunindextype global_length;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  int local_20;
  
  local_20 = 0;
  lVar2 = N_VGetLength(in_RDI);
  N_VConst(0x4000000000000000,in_RDI);
  N_VConst(0x3fe0000000000000,in_RSI);
  dVar3 = get_time();
  uVar4 = N_VDotProd(in_RDI,in_RSI);
  sync_device(in_RDI);
  dVar5 = get_time();
  iVar1 = SUNRCompare(uVar4,(double)lVar2);
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      printf("PASSED test -- N_VDotProd \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProd, Proc %d \n",(ulong)in_ECX);
    local_20 = 1;
  }
  dVar3 = max_time(in_RDI,dVar5 - dVar3);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar3,"N_VDotProd");
  }
  return local_20;
}

Assistant:

int Test_N_VDotProd(N_Vector X, N_Vector Y, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype global_length;
  sunrealtype ans;

  /* get global length */
  global_length = N_VGetLength(X);

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(HALF, Y);

  start_time = get_time();
  ans        = N_VDotProd(X, Y);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal global vector length */
  failure = SUNRCompare(ans, (sunrealtype)global_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProd, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VDotProd \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProd", maxt);

  return (fails);
}